

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DynamicSinglePixelOffsets::operator()
          (DynamicSinglePixelOffsets *this,IVec2 *pixCoord,IVec2 (*dst) [4])

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar3 = (this->m_offsetRange).m_data[0];
  iVar5 = ((this->m_offsetRange).m_data[1] - iVar3) + 1;
  iVar4 = pixCoord->m_data[1] % iVar5;
  iVar5 = pixCoord->m_data[0] % iVar5;
  iVar1 = iVar4 + iVar3;
  iVar2 = iVar5 + iVar3;
  iVar5 = iVar5 + iVar3 + 1;
  iVar3 = iVar4 + 1 + iVar3;
  (*dst)[0].m_data[0] = iVar1;
  (*dst)[0].m_data[1] = iVar5;
  (*dst)[1].m_data[0] = iVar3;
  (*dst)[1].m_data[1] = iVar5;
  (*dst)[2].m_data[0] = iVar3;
  (*dst)[2].m_data[1] = iVar2;
  (*dst)[3].m_data[0] = iVar1;
  (*dst)[3].m_data[1] = iVar2;
  return;
}

Assistant:

void operator() (const IVec2& pixCoord, IVec2 (&dst)[4]) const
	{
		const int offsetRangeSize = m_offsetRange.y() - m_offsetRange.x() + 1;
		SinglePixelOffsets(tcu::mod(pixCoord.swizzle(1,0), IVec2(offsetRangeSize)) + m_offsetRange.x())(IVec2(), dst);
	}